

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_precomputed_adjacency_list.h
# Opt level: O0

void __thiscall
AdjacencyListSBPLEnv<Point2D>::addPoint(AdjacencyListSBPLEnv<Point2D> *this,Point2D *c)

{
  mapped_type mVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  void *pvVar4;
  long in_RDI;
  vector<Point2D,_std::allocator<Point2D>_> *this_00;
  uint i;
  int *entry;
  Adjacencies a;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 local_44;
  key_type *in_stack_ffffffffffffffd8;
  map<Point2D,_int,_std::less<Point2D>,_std::allocator<std::pair<const_Point2D,_int>_>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = (vector<Point2D,_std::allocator<Point2D>_> *)(in_RDI + 0x28);
  sVar2 = std::vector<Point2D,_std::allocator<Point2D>_>::size(this_00);
  mVar1 = (mapped_type)sVar2;
  pmVar3 = std::
           map<Point2D,_int,_std::less<Point2D>,_std::allocator<std::pair<const_Point2D,_int>_>_>::
           operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *pmVar3 = mVar1;
  std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>::list
            ((list<Adjacency,_std::allocator<Adjacency>_> *)0x10dd3d);
  std::vector<Point2D,_std::allocator<Point2D>_>::push_back
            (this_00,(value_type *)CONCAT44(mVar1,in_stack_ffffffffffffffa8));
  std::
  vector<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>,_std::allocator<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>_>_>
  ::push_back((vector<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>,_std::allocator<std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>_>_>
               *)this_00,(value_type *)CONCAT44(mVar1,in_stack_ffffffffffffffa8));
  pvVar4 = operator_new__(8);
  for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
    *(undefined4 *)((long)pvVar4 + (ulong)local_44 * 4) = 0xffffffff;
  }
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)this_00,
             (value_type *)CONCAT44(mVar1,in_stack_ffffffffffffffa8));
  std::__cxx11::list<Adjacency,_std::allocator<Adjacency>_>::~list
            ((list<Adjacency,_std::allocator<Adjacency>_> *)0x10dde1);
  return;
}

Assistant:

void AdjacencyListSBPLEnv<Coords>::addPoint(const Coords& c)
{
    pointIds_[c] = points_.size();
    Adjacencies a;
    points_.push_back(c);
    adjacency_vector_.push_back(a);

    int* entry = new int[NUMOFINDICES_STATEID2IND];
    for (unsigned int i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        entry[i] = -1;
    }
    StateID2IndexMapping.push_back(entry);
}